

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68010_bkpt(m68k_info *info)

{
  if ((info->type & 0x1e) != 0) {
    build_absolute_jump_with_immediate(info,0x29,0,info->ir & 7);
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68010_bkpt(m68k_info *info)
{
	LIMIT_CPU_TYPES(info, M68010_PLUS);
	build_absolute_jump_with_immediate(info, M68K_INS_BKPT, 0, info->ir & 7);
}